

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpheaders.c
# Opt level: O0

HTTP_HEADERS_RESULT
headers_ReplaceHeaderNameValuePair(HTTP_HEADERS_HANDLE handle,char *name,char *value,_Bool replace)

{
  undefined1 auVar1 [16];
  MAP_RESULT MVar2;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  char *value_00;
  bool bVar7;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 uVar8;
  size_t local_e8;
  size_t local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  char *runNewValue;
  LOGGER_LOG l_2;
  size_t malloc_size;
  size_t valueLen;
  size_t existingValueLen;
  char *newValue;
  char *existingValue;
  HTTP_HEADERS_HANDLE_DATA *handleData;
  LOGGER_LOG l_1;
  size_t nameLen;
  size_t i;
  LOGGER_LOG l;
  HTTP_HEADERS_RESULT result;
  _Bool replace_local;
  char *value_local;
  char *name_local;
  HTTP_HEADERS_HANDLE handle_local;
  
  uVar8 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  if (((handle == (HTTP_HEADERS_HANDLE)0x0) || (name == (char *)0x0)) || (value == (char *)0x0)) {
    l._0_4_ = HTTP_HEADERS_INVALID_ARG;
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar4 = HTTP_HEADERS_RESULTStrings(HTTP_HEADERS_INVALID_ARG);
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/httpheaders.c"
                ,"headers_ReplaceHeaderNameValuePair",0x51,1,
                "invalid arg (NULL) , result= %s%s (%d)","",pcVar4,CONCAT44(uVar8,2));
    }
  }
  else {
    sVar5 = strlen(name);
    for (nameLen = 0;
        ((nameLen < sVar5 && (' ' < name[nameLen])) &&
        ((name[nameLen] < '\x7f' && (name[nameLen] != ':')))); nameLen = nameLen + 1) {
    }
    if (nameLen < sVar5) {
      l._0_4_ = HTTP_HEADERS_INVALID_ARG;
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar4 = HTTP_HEADERS_RESULTStrings(HTTP_HEADERS_INVALID_ARG);
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/httpheaders.c"
                  ,"headers_ReplaceHeaderNameValuePair",100,1,"(result = %s%s (%d))","",pcVar4,
                  CONCAT44(uVar8,2));
      }
    }
    else {
      pcVar4 = Map_GetValueFromKey(handle->headers,name);
      _result = value;
      while( true ) {
        bVar7 = true;
        if (((*_result != ' ') && (bVar7 = true, *_result != '\t')) &&
           (bVar7 = true, *_result != '\r')) {
          bVar7 = *_result == '\n';
        }
        if (!bVar7) break;
        _result = _result + 1;
      }
      if ((replace) || (pcVar4 == (char *)0x0)) {
        MVar2 = Map_AddOrUpdate(handle->headers,name,_result);
        if (MVar2 == MAP_OK) {
          l._0_4_ = HTTP_HEADERS_OK;
        }
        else {
          l._0_4_ = HTTP_HEADERS_ALLOC_FAILED;
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar4 = HTTP_HEADERS_RESULTStrings(HTTP_HEADERS_ALLOC_FAILED);
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/httpheaders.c"
                      ,"headers_ReplaceHeaderNameValuePair",0xa1,1,
                      "failed to Map_AddOrUpdate, result= %s%s (%d)","",pcVar4,CONCAT44(uVar8,3));
          }
        }
      }
      else {
        sVar5 = strlen(pcVar4);
        sVar6 = strlen(_result);
        if (sVar5 < 0xfffffffffffffffd) {
          local_c8 = sVar5 + 2;
        }
        else {
          local_c8 = 0xffffffffffffffff;
        }
        if (local_c8 < -sVar6 - 1) {
          local_d0 = local_c8 + sVar6;
        }
        else {
          local_d0 = 0xffffffffffffffff;
        }
        if (local_d0 < 0xfffffffffffffffe) {
          local_d8 = local_d0 + 1;
        }
        else {
          local_d8 = 0xffffffffffffffff;
        }
        if (local_d8 == 0) {
          local_e0 = 0;
        }
        else {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_d8;
          if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) == 0) {
            local_e8 = 0xffffffffffffffff;
          }
          else {
            local_e8 = local_d8;
          }
          local_e0 = local_e8;
        }
        if ((local_e0 == 0xffffffffffffffff) ||
           (value_00 = (char *)malloc(local_e0), value_00 == (char *)0x0)) {
          l._0_4_ = HTTP_HEADERS_ALLOC_FAILED;
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar4 = HTTP_HEADERS_RESULTStrings(HTTP_HEADERS_ALLOC_FAILED);
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/httpheaders.c"
                      ,"headers_ReplaceHeaderNameValuePair",0x7f,1,
                      "failed to malloc, size= %zu, result= %s%s (%d)",local_e0,"",pcVar4,3);
          }
        }
        else {
          memcpy(value_00,pcVar4,sVar5);
          pcVar4 = value_00 + sVar5;
          *pcVar4 = ',';
          pcVar4[1] = ' ';
          memcpy(pcVar4 + 2,_result,sVar6 + 1);
          MVar2 = Map_AddOrUpdate(handle->headers,name,value_00);
          if (MVar2 == MAP_OK) {
            l._0_4_ = HTTP_HEADERS_OK;
          }
          else {
            l._0_4_ = HTTP_HEADERS_ERROR;
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              pcVar4 = HTTP_HEADERS_RESULTStrings(HTTP_HEADERS_ERROR);
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/httpheaders.c"
                        ,"headers_ReplaceHeaderNameValuePair",0x90,1,
                        "failed to Map_AddOrUpdate, result= %s%s (%d)","",pcVar4,CONCAT44(uVar8,5));
            }
          }
          free(value_00);
        }
      }
    }
  }
  return (HTTP_HEADERS_RESULT)l;
}

Assistant:

static HTTP_HEADERS_RESULT headers_ReplaceHeaderNameValuePair(HTTP_HEADERS_HANDLE handle, const char* name, const char* value, bool replace)
{
    HTTP_HEADERS_RESULT result;
    /*Codes_SRS_HTTP_HEADERS_99_014:[ The function shall return when the handle is not valid or when name parameter is NULL or when value parameter is NULL.]*/
    if (
        (handle == NULL) ||
        (name == NULL) ||
        (value == NULL)
        )
    {
        result = HTTP_HEADERS_INVALID_ARG;
        LogError("invalid arg (NULL) , result= %" PRI_MU_ENUM "", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
    }
    else
    {
        /*Codes_SRS_HTTP_HEADERS_99_036:[ If name contains the characters outside character codes 33 to 126 then the return value shall be HTTP_HEADERS_INVALID_ARG]*/
        /*Codes_SRS_HTTP_HEADERS_99_031:[ If name contains the character ":" then the return value shall be HTTP_HEADERS_INVALID_ARG.]*/
        size_t i;
        size_t nameLen = strlen(name);
        for (i = 0; i < nameLen; i++)
        {
            if ((name[i] < 33) || (126 < name[i]) || (name[i] == ':'))
            {
                break;
            }
        }

        if (i < nameLen)
        {
            result = HTTP_HEADERS_INVALID_ARG;
            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
        }
        else
        {
            HTTP_HEADERS_HANDLE_DATA* handleData = (HTTP_HEADERS_HANDLE_DATA*)handle;
            const char* existingValue = Map_GetValueFromKey(handleData->headers, name);
            /*eat up the whitespaces from value, as per RFC 2616, chapter 4.2 "The field value MAY be preceded by any amount of LWS, though a single SP is preferred."*/
            /*Codes_SRS_HTTP_HEADERS_02_002: [The LWS from the beginning of the value shall not be stored.] */
            while ((value[0] == ' ') || (value[0] == '\t') || (value[0] == '\r') || (value[0] == '\n'))
            {
                value++;
            }

            if (!replace && (existingValue != NULL))
            {
                char* newValue;
                size_t existingValueLen = strlen(existingValue);
                size_t valueLen = strlen(value);
                size_t malloc_size = safe_add_size_t(existingValueLen, /*COMMA_AND_SPACE_LENGTH*/ 2);
                malloc_size = safe_add_size_t(malloc_size, valueLen);
                malloc_size = safe_add_size_t(malloc_size, /*EOL*/ 1);
                malloc_size = safe_multiply_size_t(malloc_size, sizeof(char));
                if (malloc_size == SIZE_MAX ||
                    (newValue = (char*)malloc(malloc_size)) == NULL)
                {
                    /*Codes_SRS_HTTP_HEADERS_99_015:[ The function shall return HTTP_HEADERS_ALLOC_FAILED when an internal request to allocate memory fails.]*/
                    result = HTTP_HEADERS_ALLOC_FAILED;
                    LogError("failed to malloc, size= %zu, result= %" PRI_MU_ENUM "", malloc_size, MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
                }
                else
                {
                    char* runNewValue;
                    /*Codes_SRS_HTTP_HEADERS_99_017:[ If the name already exists in the collection of headers, the function shall concatenate the new value after the existing value, separated by a comma and a space as in: old-value+", "+new-value.]*/
                    (void)memcpy(newValue, existingValue, existingValueLen);
                    runNewValue = newValue + existingValueLen;
                    (*runNewValue++) = ',';
                    (*runNewValue++) = ' ';
                    (void)memcpy(runNewValue, value, valueLen + /*EOL*/ 1);

                    /*Codes_SRS_HTTP_HEADERS_99_016:[ The function shall store the name:value pair in such a way that when later retrieved by a call to GetHeader it will return a string that shall strcmp equal to the name+": "+value.]*/
                    if (Map_AddOrUpdate(handleData->headers, name, newValue) != MAP_OK)
                    {
                        /*Codes_SRS_HTTP_HEADERS_99_015:[ The function shall return HTTP_HEADERS_ALLOC_FAILED when an internal request to allocate memory fails.]*/
                        result = HTTP_HEADERS_ERROR;
                        LogError("failed to Map_AddOrUpdate, result= %" PRI_MU_ENUM "", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
                    }
                    else
                    {
                        /*Codes_SRS_HTTP_HEADERS_99_013:[ The function shall return HTTP_HEADERS_OK when execution is successful.]*/
                        result = HTTP_HEADERS_OK;
                    }
                    free(newValue);
                }
            }
            else
            {
                /*Codes_SRS_HTTP_HEADERS_99_016:[ The function shall store the name:value pair in such a way that when later retrieved by a call to GetHeader it will return a string that shall strcmp equal to the name+": "+value.]*/
                if (Map_AddOrUpdate(handleData->headers, name, value) != MAP_OK)
                {
                    /*Codes_SRS_HTTP_HEADERS_99_015:[ The function shall return HTTP_HEADERS_ALLOC_FAILED when an internal request to allocate memory fails.]*/
                    result = HTTP_HEADERS_ALLOC_FAILED;
                    LogError("failed to Map_AddOrUpdate, result= %" PRI_MU_ENUM "", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
                }
                else
                {
                    result = HTTP_HEADERS_OK;
                }
            }
        }
    }

    return result;
}